

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::SubroutineFunction
          (SubroutineFunction *this,UniformValueGenerator *generator,Index _index)

{
  UniformType local_c8;
  UniformValueGenerator *local_38;
  UniformValueGenerator *generator_local;
  SubroutineFunction *this_local;
  DefOccurenceEnum local_20;
  SubroutineFunction *local_18;
  Index _index_local;
  
  local_20 = (DefOccurenceEnum)_index.super_LayoutSpecifierBase.occurence.occurence;
  this_local = _index.super_LayoutSpecifierBase._0_8_;
  (this->index).super_LayoutSpecifierBase.occurence.occurence = local_20;
  *(SubroutineFunction **)&(this->index).super_LayoutSpecifierBase = this_local;
  local_38 = generator;
  generator_local = (UniformValueGenerator *)this;
  local_18 = this_local;
  _index_local.super_LayoutSpecifierBase.val = local_20;
  UniformType::UniformType(&local_c8,0x8b52,0);
  UniformValue::UniformValue(&this->embeddedRetVal,&local_c8,local_38);
  UniformType::~UniformType(&local_c8);
  std::__cxx11::string::string((string *)&this->name);
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}